

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O3

void us_internal_loop_data_free(us_loop_t *loop)

{
  us_internal_free_loop_ssl_data(loop);
  free((loop->data).recv_buf);
  us_timer_close((loop->data).sweep_timer);
  us_internal_async_close((loop->data).wakeup_async);
  return;
}

Assistant:

void us_internal_loop_data_free(struct us_loop_t *loop) {
#ifndef LIBUS_NO_SSL
    us_internal_free_loop_ssl_data(loop);
#endif

    free(loop->data.recv_buf);

    us_timer_close(loop->data.sweep_timer);
    us_internal_async_close(loop->data.wakeup_async);
}